

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O3

void __thiscall CompareUUID_Ne_Test::TestBody(CompareUUID_Ne_Test *this)

{
  char *in_R9;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  auVar1[0] = -((this->super_CompareUUID).t2_.data_._M_elems[0] ==
               (this->super_CompareUUID).t1_.data_._M_elems[0]);
  auVar1[1] = -((this->super_CompareUUID).t2_.data_._M_elems[1] ==
               (this->super_CompareUUID).t1_.data_._M_elems[1]);
  auVar1[2] = -((this->super_CompareUUID).t2_.data_._M_elems[2] ==
               (this->super_CompareUUID).t1_.data_._M_elems[2]);
  auVar1[3] = -((this->super_CompareUUID).t2_.data_._M_elems[3] ==
               (this->super_CompareUUID).t1_.data_._M_elems[3]);
  auVar1[4] = -((this->super_CompareUUID).t2_.data_._M_elems[4] ==
               (this->super_CompareUUID).t1_.data_._M_elems[4]);
  auVar1[5] = -((this->super_CompareUUID).t2_.data_._M_elems[5] ==
               (this->super_CompareUUID).t1_.data_._M_elems[5]);
  auVar1[6] = -((this->super_CompareUUID).t2_.data_._M_elems[6] ==
               (this->super_CompareUUID).t1_.data_._M_elems[6]);
  auVar1[7] = -((this->super_CompareUUID).t2_.data_._M_elems[7] ==
               (this->super_CompareUUID).t1_.data_._M_elems[7]);
  auVar1[8] = -((this->super_CompareUUID).t2_.data_._M_elems[8] ==
               (this->super_CompareUUID).t1_.data_._M_elems[8]);
  auVar1[9] = -((this->super_CompareUUID).t2_.data_._M_elems[9] ==
               (this->super_CompareUUID).t1_.data_._M_elems[9]);
  auVar1[10] = -((this->super_CompareUUID).t2_.data_._M_elems[10] ==
                (this->super_CompareUUID).t1_.data_._M_elems[10]);
  auVar1[0xb] = -((this->super_CompareUUID).t2_.data_._M_elems[0xb] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xb]);
  auVar1[0xc] = -((this->super_CompareUUID).t2_.data_._M_elems[0xc] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xc]);
  auVar1[0xd] = -((this->super_CompareUUID).t2_.data_._M_elems[0xd] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xd]);
  auVar1[0xe] = -((this->super_CompareUUID).t2_.data_._M_elems[0xe] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xe]);
  auVar1[0xf] = -((this->super_CompareUUID).t2_.data_._M_elems[0xf] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xf]);
  local_40[0] = (internal)
                ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar1[0xf] >> 7) << 0xf) == 0xffff);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"t1_ != t2_","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0xe3,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  auVar2[0] = -((this->super_CompareUUID).t3_.data_._M_elems[0] ==
               (this->super_CompareUUID).t1_.data_._M_elems[0]);
  auVar2[1] = -((this->super_CompareUUID).t3_.data_._M_elems[1] ==
               (this->super_CompareUUID).t1_.data_._M_elems[1]);
  auVar2[2] = -((this->super_CompareUUID).t3_.data_._M_elems[2] ==
               (this->super_CompareUUID).t1_.data_._M_elems[2]);
  auVar2[3] = -((this->super_CompareUUID).t3_.data_._M_elems[3] ==
               (this->super_CompareUUID).t1_.data_._M_elems[3]);
  auVar2[4] = -((this->super_CompareUUID).t3_.data_._M_elems[4] ==
               (this->super_CompareUUID).t1_.data_._M_elems[4]);
  auVar2[5] = -((this->super_CompareUUID).t3_.data_._M_elems[5] ==
               (this->super_CompareUUID).t1_.data_._M_elems[5]);
  auVar2[6] = -((this->super_CompareUUID).t3_.data_._M_elems[6] ==
               (this->super_CompareUUID).t1_.data_._M_elems[6]);
  auVar2[7] = -((this->super_CompareUUID).t3_.data_._M_elems[7] ==
               (this->super_CompareUUID).t1_.data_._M_elems[7]);
  auVar2[8] = -((this->super_CompareUUID).t3_.data_._M_elems[8] ==
               (this->super_CompareUUID).t1_.data_._M_elems[8]);
  auVar2[9] = -((this->super_CompareUUID).t3_.data_._M_elems[9] ==
               (this->super_CompareUUID).t1_.data_._M_elems[9]);
  auVar2[10] = -((this->super_CompareUUID).t3_.data_._M_elems[10] ==
                (this->super_CompareUUID).t1_.data_._M_elems[10]);
  auVar2[0xb] = -((this->super_CompareUUID).t3_.data_._M_elems[0xb] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xb]);
  auVar2[0xc] = -((this->super_CompareUUID).t3_.data_._M_elems[0xc] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xc]);
  auVar2[0xd] = -((this->super_CompareUUID).t3_.data_._M_elems[0xd] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xd]);
  auVar2[0xe] = -((this->super_CompareUUID).t3_.data_._M_elems[0xe] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xe]);
  auVar2[0xf] = -((this->super_CompareUUID).t3_.data_._M_elems[0xf] ==
                 (this->super_CompareUUID).t1_.data_._M_elems[0xf]);
  local_40[0] = (internal)
                ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar2[0xf] >> 7) << 0xf) != 0xffff);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"t1_ != t3_","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0xe4,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

TEST_F (CompareUUID, Ne) {
    EXPECT_FALSE (t1_ != t2_);
    EXPECT_TRUE (t1_ != t3_);
}